

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_script.cpp
# Opt level: O3

int CfdSetScriptTreeFromString
              (void *handle,void *tree_handle,char *tree_string,char *tapscript,uint8_t leaf_version
              ,char *control_nodes)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  long *plVar3;
  bool bVar4;
  CfdException *pCVar5;
  vector<cfd::core::TapBranch,std::allocator<cfd::core::TapBranch>> *this;
  undefined8 *puVar6;
  ulong uVar7;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> stack;
  ByteData256 node;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> target_nodes;
  string control_str;
  TapBranch branch;
  string local_1a8;
  char *local_188;
  void *local_180;
  ByteData local_178;
  TaprootScriptTree *local_160;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_158;
  TaprootScriptTree local_138;
  TapBranch local_a8;
  
  local_188 = tree_string;
  local_180 = handle;
  cfd::Initialize();
  local_138.super_TapBranch._vptr_TapBranch = (_func_int **)&local_138.super_TapBranch.script_;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"TapscriptTree","");
  cfd::capi::CheckBuffer(tree_handle,(string *)&local_138);
  if ((Script *)local_138.super_TapBranch._vptr_TapBranch != &local_138.super_TapBranch.script_) {
    operator_delete(local_138.super_TapBranch._vptr_TapBranch);
  }
  local_160 = (TaprootScriptTree *)**(long **)((long)tree_handle + 0x10);
  if ((TaprootScriptTree *)(*(long **)((long)tree_handle + 0x10))[1] == local_160) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
  }
  bVar4 = cfd::capi::IsEmptyString(tapscript);
  if (bVar4) {
    cfd::core::TapBranch::TapBranch(&local_a8);
    bVar4 = cfd::capi::IsEmptyString(local_188);
    if (!bVar4) {
      std::__cxx11::string::string((string *)&local_1a8,local_188,(allocator *)&local_158);
      cfd::core::TapBranch::FromString(&local_138.super_TapBranch,&local_1a8);
      cfd::core::TapBranch::operator=(&local_a8,&local_138.super_TapBranch);
      cfd::core::TapBranch::~TapBranch(&local_138.super_TapBranch);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p);
      }
    }
    this = *(vector<cfd::core::TapBranch,std::allocator<cfd::core::TapBranch>> **)
            ((long)tree_handle + 0x18);
    puVar1 = *(undefined8 **)this;
    puVar2 = *(undefined8 **)(this + 8);
    puVar6 = puVar1;
    if (puVar2 != puVar1) {
      do {
        (**(code **)*puVar6)(puVar6);
        puVar6 = puVar6 + 0xf;
      } while (puVar6 != puVar2);
      *(undefined8 **)(this + 8) = puVar1;
      this = *(vector<cfd::core::TapBranch,std::allocator<cfd::core::TapBranch>> **)
              ((long)tree_handle + 0x18);
    }
    std::vector<cfd::core::TapBranch,std::allocator<cfd::core::TapBranch>>::
    emplace_back<cfd::core::TapBranch&>(this,&local_a8);
    cfd::core::TaprootScriptTree::TaprootScriptTree(&local_138);
    cfd::core::TaprootScriptTree::operator=(local_160,&local_138);
    local_138.super_TapBranch._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              (&local_138.nodes_);
    cfd::core::TapBranch::~TapBranch(&local_138.super_TapBranch);
    cfd::core::TapBranch::~TapBranch(&local_a8);
  }
  else {
    bVar4 = cfd::capi::IsEmptyString(local_188);
    if (bVar4) {
      local_138.super_TapBranch._vptr_TapBranch = (_func_int **)0x5e1670;
      local_138.super_TapBranch.has_leaf_ = true;
      local_138.super_TapBranch.leaf_version_ = '\x02';
      local_138.super_TapBranch._10_2_ = 0;
      local_138.super_TapBranch.script_._vptr_Script = (_func_int **)0x5e19f5;
      cfd::core::logger::log<>
                ((CfdSourceLocation *)&local_138,kCfdLogLevelWarning,"tree_string is null or empty."
                );
      pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
      local_138.super_TapBranch._vptr_TapBranch = (_func_int **)&local_138.super_TapBranch.script_;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,"Failed to parameter. tree_string is null or empty.","");
      cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&local_138);
      __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    if (leaf_version != 0xc0) {
      pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
      local_138.super_TapBranch._vptr_TapBranch = (_func_int **)&local_138.super_TapBranch.script_;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,"Failed to parameter. leaf_version is not support.","");
      cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&local_138);
      __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    std::__cxx11::string::string((string *)&local_138,tapscript,(allocator *)&local_1a8);
    cfd::core::Script::Script((Script *)&local_a8,(string *)&local_138);
    if ((Script *)local_138.super_TapBranch._vptr_TapBranch != &local_138.super_TapBranch.script_) {
      operator_delete(local_138.super_TapBranch._vptr_TapBranch);
    }
    local_158.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_158.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_158.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar4 = cfd::capi::IsEmptyString(control_nodes);
    if (!bVar4) {
      std::__cxx11::string::string((string *)&local_138,control_nodes,(allocator *)&local_1a8);
      if ((local_138.super_TapBranch._8_4_ & 0x3f) == 0) {
        if (CONCAT44(local_138.super_TapBranch._12_4_,local_138.super_TapBranch._8_4_) != 0) {
          uVar7 = CONCAT44(local_138.super_TapBranch._12_4_,local_138.super_TapBranch._8_4_) >> 6;
          do {
            std::__cxx11::string::substr((ulong)&local_1a8,(ulong)&local_138);
            cfd::core::ByteData256::ByteData256((ByteData256 *)&local_178,&local_1a8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
              operator_delete(local_1a8._M_dataplus._M_p);
            }
            std::vector<cfd::core::ByteData256,std::allocator<cfd::core::ByteData256>>::
            emplace_back<cfd::core::ByteData256&>
                      ((vector<cfd::core::ByteData256,std::allocator<cfd::core::ByteData256>> *)
                       &local_158,(ByteData256 *)&local_178);
            if (local_178.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_178.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            uVar7 = uVar7 - 1;
          } while (uVar7 != 0);
        }
      }
      else {
        local_1a8._M_dataplus._M_p = (pointer)0x0;
        local_1a8._M_string_length = 0;
        local_1a8.field_2._M_allocated_capacity = 0;
        cfd::core::Script::GetData(&local_178,(Script *)&local_a8);
        std::vector<cfd::core::ByteData,std::allocator<cfd::core::ByteData>>::
        emplace_back<cfd::core::ByteData_const>
                  ((vector<cfd::core::ByteData,std::allocator<cfd::core::ByteData>> *)&local_1a8,
                   &local_178);
        if (local_178.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_178.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        cfd::core::ByteData::ByteData(&local_178,(string *)&local_138);
        std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::
        emplace_back<cfd::core::ByteData>
                  ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&local_1a8,
                   &local_178);
        if (local_178.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_178.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        cfd::core::TaprootUtil::ParseTaprootSignData
                  ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&local_1a8,
                   (SchnorrSignature *)0x0,(bool *)0x0,(uint8_t *)0x0,(SchnorrPubkey *)0x0,
                   &local_158,(Script *)0x0,
                   (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)0x0,
                   (ByteData *)0x0);
        std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
                  ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&local_1a8);
      }
      if ((Script *)local_138.super_TapBranch._vptr_TapBranch != &local_138.super_TapBranch.script_)
      {
        operator_delete(local_138.super_TapBranch._vptr_TapBranch);
      }
    }
    std::__cxx11::string::string((string *)&local_1a8,local_188,(allocator *)&local_178);
    cfd::core::TaprootScriptTree::FromString(&local_138,&local_1a8,(Script *)&local_a8,&local_158);
    cfd::core::TaprootScriptTree::operator=(local_160,&local_138);
    local_138.super_TapBranch._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              (&local_138.nodes_);
    cfd::core::TapBranch::~TapBranch(&local_138.super_TapBranch);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p);
    }
    plVar3 = *(long **)((long)tree_handle + 0x18);
    puVar1 = (undefined8 *)*plVar3;
    puVar2 = (undefined8 *)plVar3[1];
    puVar6 = puVar1;
    if (puVar2 != puVar1) {
      do {
        (**(code **)*puVar6)(puVar6);
        puVar6 = puVar6 + 0xf;
      } while (puVar6 != puVar2);
      plVar3[1] = (long)puVar1;
    }
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              (&local_158);
    cfd::core::Script::~Script((Script *)&local_a8);
  }
  return 0;
}

Assistant:

int CfdSetScriptTreeFromString(
    void* handle, void* tree_handle, const char* tree_string,
    const char* tapscript, uint8_t leaf_version, const char* control_nodes) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(tree_handle, kPrefixTapscriptTree);
    CfdCapiTapscriptTree* buffer =
        static_cast<CfdCapiTapscriptTree*>(tree_handle);
    auto& tree = buffer->tree_buffer->at(0);

    if (IsEmptyString(tapscript)) {
      TapBranch branch;
      if (!IsEmptyString(tree_string)) {
        branch = TapBranch::FromString(tree_string);
      }
      buffer->branch_buffer->clear();
      buffer->branch_buffer->emplace_back(branch);
      tree = TaprootScriptTree();
    } else if (IsEmptyString(tree_string)) {
      warn(CFD_LOG_SOURCE, "tree_string is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tree_string is null or empty.");
    } else {
      if (leaf_version != TaprootScriptTree::kTapScriptLeafVersion) {
        // TODO(k-matsuzawa): Support in the future.
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. leaf_version is not support.");
      }
      Script tapscript_obj(tapscript);
      std::vector<ByteData256> target_nodes;
      if (!IsEmptyString(control_nodes)) {
        std::string control_str(control_nodes);
        if ((control_str.size() % (cfd::core::kByteData256Length * 2)) == 0) {
          size_t split_size = cfd::core::kByteData256Length * 2;
          size_t max = control_str.size() / split_size;
          for (size_t index = 0; index < max; ++index) {
            size_t offset = index * split_size;
            ByteData256 node(control_str.substr(offset, split_size));
            target_nodes.emplace_back(node);
          }
        } else {  // control block
          std::vector<ByteData> stack;
          stack.emplace_back(tapscript_obj.GetData());
          stack.emplace_back(ByteData(control_str));
          TaprootUtil::ParseTaprootSignData(
              stack, nullptr, nullptr, nullptr, nullptr, &target_nodes,
              nullptr);
        }
      }

      tree = TaprootScriptTree::FromString(
          tree_string, tapscript_obj, target_nodes);
      buffer->branch_buffer->clear();
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}